

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool __thiscall ON_Font::SetAppleFontWeightTrait(ON_Font *this,double apple_font_weight_trait)

{
  bool bVar1;
  Weight font_weight;
  
  bVar1 = ON_IsValid(apple_font_weight_trait);
  if (bVar1) {
    font_weight = WeightFromAppleFontWeightTrait(apple_font_weight_trait);
    PostScriptName((ON_Font *)&stack0xffffffffffffffe0);
    ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffffe0);
    bVar1 = Internal_SetFontWeightTrio(this,font_weight,-1,apple_font_weight_trait,false);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffe0);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_Font::SetAppleFontWeightTrait(
  double apple_font_weight_trait
)
{
  if (false == ON_IsValid(apple_font_weight_trait))
    return false; // nan or unset value

  const ON_Font::Weight font_weight = ON_Font::WeightFromAppleFontWeightTrait(apple_font_weight_trait);

  return Internal_SetFontWeightTrio(
    font_weight, 
    -1, 
    apple_font_weight_trait,
    PostScriptName().IsEmpty()
  );
}